

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O3

void helper_pfrsqrt_x86_64(CPUX86State *env,MMXReg *d,MMXReg *s)

{
  float32 fVar1;
  uint uVar2;
  
  uVar2 = s->_l_MMXReg[0];
  d->_s_MMXReg[1] = uVar2 & 0x7fffffff;
  fVar1 = float32_sqrt_x86_64(uVar2 & 0x7fffffff,&env->mmx_status);
  fVar1 = float32_div_x86_64(0x3f800000,fVar1,&env->mmx_status);
  d->_s_MMXReg[1] = fVar1;
  uVar2 = s->_l_MMXReg[0] & 0x80000000 | fVar1;
  d->_l_MMXReg[1] = uVar2;
  d->_l_MMXReg[0] = uVar2;
  return;
}

Assistant:

void helper_pfrsqrt(CPUX86State *env, MMXReg *d, MMXReg *s)
{
    d->MMX_L(1) = s->MMX_L(0) & 0x7fffffff;
    d->MMX_S(1) = float32_div(float32_one,
                              float32_sqrt(d->MMX_S(1), &env->mmx_status),
                              &env->mmx_status);
    d->MMX_L(1) |= s->MMX_L(0) & 0x80000000;
    d->MMX_L(0) = d->MMX_L(1);
}